

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_get_source(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint32_t c;
  uint32_t c_00;
  int iVar8;
  JSObject *p;
  uint uVar9;
  bool bVar10;
  JSValue JVar11;
  StringBuffer b_s;
  StringBuffer local_50;
  
  if ((int)this_val.tag == -1) {
    BVar4 = js_same_value(ctx,this_val,ctx->class_proto[0x12]);
    if (BVar4 == 0) {
      if (*(short *)((long)this_val.u.ptr + 6) != 0x12) {
        JS_ThrowTypeErrorInvalidClass(ctx,0x12);
        goto LAB_0013d63c;
      }
      lVar1 = *(long *)((long)this_val.u.ptr + 0x30);
      local_50.size = *(uint *)(lVar1 + 4) & 0x7fffffff;
      if (local_50.size == 0) goto LAB_0013d5fd;
      local_50.is_wide_char = *(uint *)(lVar1 + 4) >> 0x1f;
      local_50.len = 0;
      local_50.error_status = 0;
      local_50.ctx = ctx;
      local_50.str = js_alloc_string(ctx,local_50.size,local_50.is_wide_char);
      if (local_50.str == (JSString *)0x0) {
        local_50.size = 0;
        local_50.error_status = -1;
      }
      uVar9 = *(uint *)(lVar1 + 4) & 0x7fffffff;
      if (uVar9 != 0) {
        bVar2 = false;
        iVar8 = 0;
        do {
          lVar6 = (long)iVar8;
          iVar7 = (int)*(undefined8 *)(lVar1 + 4);
          if (iVar7 < 0) {
            c = (uint32_t)*(ushort *)(lVar1 + 0x10 + lVar6 * 2);
          }
          else {
            c = (uint32_t)*(byte *)(lVar1 + 0x10 + lVar6);
          }
          uVar5 = lVar6 + 1;
          if (0x5a < c) {
            if (c == 0x5b) {
              bVar10 = true;
              c = 0x5b;
              bVar3 = !bVar2;
              bVar2 = bVar10;
              if ((bVar3) && ((int)uVar5 < (int)uVar9)) {
                if (iVar7 < 0) {
                  bVar10 = *(short *)(lVar1 + 0x12 + lVar6 * 2) == 0x5d;
                }
                else {
                  bVar10 = *(char *)(lVar1 + 0x10 + uVar5) == ']';
                }
                if (bVar10) {
                  bVar2 = true;
                  c = 0x5d;
                  c_00 = 0x5b;
                  uVar5 = (ulong)(iVar8 + 2);
                  goto LAB_0013d7b2;
                }
              }
            }
            else if (c == 0x5d) {
              c = 0x5d;
              bVar2 = false;
            }
            else if ((c == 0x5c) && (c = 0x5c, (int)uVar5 < (int)uVar9)) {
              if (iVar7 < 0) {
                c = (uint32_t)*(ushort *)(lVar1 + 0x12 + lVar6 * 2);
              }
              else {
                c = (uint32_t)*(byte *)(lVar1 + 0x10 + uVar5);
              }
              uVar5 = (ulong)(iVar8 + 2);
              goto LAB_0013d7ad;
            }
            goto LAB_0013d7bf;
          }
          c_00 = 0x5c;
          if (c == 10) {
            c = 0x6e;
LAB_0013d7ad:
            c_00 = 0x5c;
LAB_0013d7b2:
            string_buffer_putc16(&local_50,c_00);
          }
          else {
            if (c == 0xd) {
              c = 0x72;
              goto LAB_0013d7b2;
            }
            if (c == 0x2f) {
              c = 0x2f;
              bVar10 = !bVar2;
              bVar2 = true;
              if (bVar10) {
                bVar2 = false;
                goto LAB_0013d7b2;
              }
            }
          }
LAB_0013d7bf:
          string_buffer_putc16(&local_50,c);
          iVar8 = (int)uVar5;
        } while (iVar8 < (int)uVar9);
      }
      JVar11 = string_buffer_end(&local_50);
    }
    else {
LAB_0013d5fd:
      JVar11 = JS_NewStringLen(ctx,"(?:)",4);
    }
    uVar5 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
LAB_0013d63c:
    JVar11 = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
  }
  JVar11.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar5);
  return JVar11;
}

Assistant:

static JSValue js_regexp_get_source(JSContext *ctx, JSValueConst this_val)
{
    JSRegExp *re;
    JSString *p;
    StringBuffer b_s, *b = &b_s;
    int i, n, c, c2, bra;

    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    if (js_same_value(ctx, this_val, ctx->class_proto[JS_CLASS_REGEXP]))
        goto empty_regex;

    re = js_get_regexp(ctx, this_val, TRUE);
    if (!re)
        return JS_EXCEPTION;

    p = re->pattern;

    if (p->len == 0) {
    empty_regex:
        return JS_NewString(ctx, "(?:)");
    }    
    string_buffer_init2(ctx, b, p->len, p->is_wide_char);

    /* Escape '/' and newline sequences as needed */
    bra = 0;
    for (i = 0, n = p->len; i < n;) {
        c2 = -1;
        switch (c = string_get(p, i++)) {
        case '\\':
            if (i < n)
                c2 = string_get(p, i++);
            break;
        case ']':
            bra = 0;
            break;
        case '[':
            if (!bra) {
                if (i < n && string_get(p, i) == ']')
                    c2 = string_get(p, i++);
                bra = 1;
            }
            break;
        case '\n':
            c = '\\';
            c2 = 'n';
            break;
        case '\r':
            c = '\\';
            c2 = 'r';
            break;
        case '/':
            if (!bra) {
                c = '\\';
                c2 = '/';
            }
            break;
        }
        string_buffer_putc16(b, c);
        if (c2 >= 0)
            string_buffer_putc16(b, c2);
    }
    return string_buffer_end(b);
}